

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall
caffe::DummyDataParameter::SerializeWithCachedSizes
          (DummyDataParameter *this,CodedOutputStream *output)

{
  int iVar1;
  void *pvVar2;
  Type *value;
  uint *puVar3;
  Type *value_00;
  int iVar4;
  
  iVar1 = (this->data_filler_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar4 = 0;
    do {
      value = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::FillerParameter>::TypeHandler>
                        (&(this->data_filler_).super_RepeatedPtrFieldBase,iVar4);
      google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
                (1,(MessageLite *)value,output);
      iVar4 = iVar4 + 1;
    } while (iVar1 != iVar4);
  }
  iVar1 = (this->num_).current_size_;
  if (0 < iVar1) {
    iVar4 = 0;
    do {
      puVar3 = google::protobuf::RepeatedField<unsigned_int>::Get(&this->num_,iVar4);
      google::protobuf::internal::WireFormatLite::WriteUInt32(2,*puVar3,output);
      iVar4 = iVar4 + 1;
    } while (iVar1 != iVar4);
  }
  iVar1 = (this->channels_).current_size_;
  if (0 < iVar1) {
    iVar4 = 0;
    do {
      puVar3 = google::protobuf::RepeatedField<unsigned_int>::Get(&this->channels_,iVar4);
      google::protobuf::internal::WireFormatLite::WriteUInt32(3,*puVar3,output);
      iVar4 = iVar4 + 1;
    } while (iVar1 != iVar4);
  }
  iVar1 = (this->height_).current_size_;
  if (0 < iVar1) {
    iVar4 = 0;
    do {
      puVar3 = google::protobuf::RepeatedField<unsigned_int>::Get(&this->height_,iVar4);
      google::protobuf::internal::WireFormatLite::WriteUInt32(4,*puVar3,output);
      iVar4 = iVar4 + 1;
    } while (iVar1 != iVar4);
  }
  iVar1 = (this->width_).current_size_;
  if (0 < iVar1) {
    iVar4 = 0;
    do {
      puVar3 = google::protobuf::RepeatedField<unsigned_int>::Get(&this->width_,iVar4);
      google::protobuf::internal::WireFormatLite::WriteUInt32(5,*puVar3,output);
      iVar4 = iVar4 + 1;
    } while (iVar1 != iVar4);
  }
  iVar1 = (this->shape_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar4 = 0;
    do {
      value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
                           (&(this->shape_).super_RepeatedPtrFieldBase,iVar4);
      google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
                (6,(MessageLite *)value_00,output);
      iVar4 = iVar4 + 1;
    } while (iVar1 != iVar4);
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    return;
  }
  google::protobuf::internal::WireFormat::SerializeUnknownFields
            ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),output);
  return;
}

Assistant:

void DummyDataParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.DummyDataParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .caffe.FillerParameter data_filler = 1;
  for (unsigned int i = 0, n = this->data_filler_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      1, this->data_filler(i), output);
  }

  // repeated uint32 num = 2;
  for (int i = 0, n = this->num_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(
      2, this->num(i), output);
  }

  // repeated uint32 channels = 3;
  for (int i = 0, n = this->channels_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(
      3, this->channels(i), output);
  }

  // repeated uint32 height = 4;
  for (int i = 0, n = this->height_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(
      4, this->height(i), output);
  }

  // repeated uint32 width = 5;
  for (int i = 0, n = this->width_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(
      5, this->width(i), output);
  }

  // repeated .caffe.BlobShape shape = 6;
  for (unsigned int i = 0, n = this->shape_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      6, this->shape(i), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.DummyDataParameter)
}